

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compatibility.cpp
# Opt level: O1

void CheckCompatibility(MapData *map)

{
  Node *pNVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t j;
  long lVar5;
  Node *pNVar6;
  FCompatValues *pFVar7;
  FMD5Holder md5;
  long local_38;
  long local_30;
  
  iVar3 = FWadCollection::GetLumpFile(&Wads,map->lumpnum);
  if (((iVar3 == 1) && ((gameinfo.flags & 0x10U) != 0)) && (level.maptype == MAPTYPE_DOOM)) {
    uVar4 = (gameinfo.flags & 0x20U) >> 4 | 0x20000001;
LAB_0035c5da:
    ii_compatflags2 = 0;
    ib_compatflags = 0;
    ii_compatparams = -1;
    bVar2 = true;
    ii_compatflags = uVar4;
  }
  else {
    iVar3 = FWadCollection::GetLumpFile(&Wads,map->lumpnum);
    if ((iVar3 == 1) && ((gameinfo.flags & 0x40U) != 0)) {
      bVar2 = FWadCollection::CheckLumpName(&Wads,map->lumpnum,"MAP36");
      uVar4 = 0x40000000;
      if (bVar2) goto LAB_0035c5da;
    }
    iVar3 = FWadCollection::GetLumpFile(&Wads,map->lumpnum);
    if ((iVar3 == 2) && ((gameinfo.flags & 0x80U) != 0)) {
      bVar2 = FWadCollection::CheckLumpName(&Wads,map->lumpnum,"MAP47");
      uVar4 = 0x40000000;
      if (bVar2) goto LAB_0035c5da;
    }
    bVar2 = false;
  }
  MapData::GetChecksum(map,(BYTE *)&local_38);
  pNVar1 = BCompatMap.Nodes + (BCompatMap.Size - 1 & (uint)local_38);
  do {
    pNVar6 = pNVar1;
    if ((pNVar6 == (Node *)0x0) || (pNVar1 = pNVar6->Next, pNVar1 == (Node *)0x1)) {
      pNVar6 = (Node *)0x0;
      break;
    }
  } while ((*(long *)&(pNVar6->Pair).Key != local_38) ||
          (*(long *)((long)&(pNVar6->Pair).Key + 8) != local_30));
  pFVar7 = &(pNVar6->Pair).Value;
  if (pNVar6 == (Node *)0x0) {
    pFVar7 = (FCompatValues *)0x0;
  }
  if (2 < developer.Value) {
    Printf("MD5 = ");
    lVar5 = 0;
    do {
      Printf("%02X",(ulong)*(byte *)((long)&local_38 + lVar5));
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    if (pNVar6 == (Node *)0x0) {
      Printf("\n");
    }
    else {
      Printf(", cflags = %08x, cflags2 = %08x, bflags = %08x\n",(ulong)(uint)pFVar7->CompatFlags[0],
             (ulong)(uint)pFVar7->CompatFlags[1],(ulong)(uint)pFVar7->CompatFlags[2]);
    }
  }
  if (pNVar6 == (Node *)0x0) {
    ii_compatparams = 0xffffffff;
    if (!bVar2) {
      ii_compatflags = 0;
      ii_compatflags2 = 0;
      ib_compatflags = 0;
    }
  }
  else {
    if (!bVar2) {
      ii_compatflags = pFVar7->CompatFlags[0];
      ii_compatflags2 = pFVar7->CompatFlags[1];
      ib_compatflags = pFVar7->CompatFlags[2];
    }
    ii_compatparams = pFVar7->ExtCommandIndex;
  }
  if (compatflags.super_FBaseCVar.m_Callback != (_func_void_FBaseCVar_ptr *)0x0) {
    (*compatflags.super_FBaseCVar.m_Callback)(&compatflags.super_FBaseCVar);
  }
  if (compatflags2.super_FBaseCVar.m_Callback != (_func_void_FBaseCVar_ptr *)0x0) {
    (*compatflags2.super_FBaseCVar.m_Callback)(&compatflags2.super_FBaseCVar);
  }
  if ((level.flags2._2_1_ & 0x80) != 0) {
    ib_compatflags = ib_compatflags | 0x100;
  }
  return;
}

Assistant:

void CheckCompatibility(MapData *map)
{
	FMD5Holder md5;
	FCompatValues *flags;
	bool onlyparams = true;

	// When playing Doom IWAD levels force COMPAT_SHORTTEX and COMPATF_LIGHT.
	// I'm not sure if the IWAD maps actually need COMPATF_LIGHT but it certainly does not hurt.
	// TNT's MAP31 also needs COMPATF_STAIRINDEX but that only gets activated for TNT.WAD.
	if (Wads.GetLumpFile(map->lumpnum) == 1 && (gameinfo.flags & GI_COMPATSHORTTEX) && level.maptype == MAPTYPE_DOOM)
	{
		ii_compatflags = COMPATF_SHORTTEX|COMPATF_LIGHT;
		if (gameinfo.flags & GI_COMPATSTAIRS) ii_compatflags |= COMPATF_STAIRINDEX;
		ii_compatflags2 = 0;
		ib_compatflags = 0;
		ii_compatparams = -1;
	}
	else if (Wads.GetLumpFile(map->lumpnum) == 1 && (gameinfo.flags & GI_COMPATPOLY1) && Wads.CheckLumpName(map->lumpnum, "MAP36"))
	{
		ii_compatflags = COMPATF_POLYOBJ;
		ii_compatflags2 = 0;
		ib_compatflags = 0;
		ii_compatparams = -1;
	}
	else if (Wads.GetLumpFile(map->lumpnum) == 2 && (gameinfo.flags & GI_COMPATPOLY2) && Wads.CheckLumpName(map->lumpnum, "MAP47"))
	{
		ii_compatflags = COMPATF_POLYOBJ;
		ii_compatflags2 = 0;
		ib_compatflags = 0;
		ii_compatparams = -1;
	}
	else
	{
		onlyparams = false;
	}

	map->GetChecksum(md5.Bytes);

	flags = BCompatMap.CheckKey(md5);

	if (developer >= DMSG_NOTIFY)
	{
		Printf("MD5 = ");
		for (size_t j = 0; j < sizeof(md5.Bytes); ++j)
		{
			Printf("%02X", md5.Bytes[j]);
		}
		if (flags != NULL)
		{
			Printf(", cflags = %08x, cflags2 = %08x, bflags = %08x\n",
				flags->CompatFlags[SLOT_COMPAT], flags->CompatFlags[SLOT_COMPAT2], flags->CompatFlags[SLOT_BCOMPAT]);
		}
		else
		{
			Printf("\n");
		}
	}

	if (flags != NULL)
	{
		if (!onlyparams)
		{
			ii_compatflags = flags->CompatFlags[SLOT_COMPAT];
			ii_compatflags2 = flags->CompatFlags[SLOT_COMPAT2];
			ib_compatflags = flags->CompatFlags[SLOT_BCOMPAT];
		}
		ii_compatparams = flags->ExtCommandIndex;
	}
	else
	{
		if (!onlyparams)
		{
			ii_compatflags = 0;
			ii_compatflags2 = 0;
			ib_compatflags = 0;
		}
		ii_compatparams = -1;
	}
	// Reset i_compatflags
	compatflags.Callback();
	compatflags2.Callback();
	// Set floatbob compatibility for all maps with an original Hexen MAPINFO.
	if (level.flags2 & LEVEL2_HEXENHACK)
	{
		ib_compatflags |= BCOMPATF_FLOATBOB;
	}
}